

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

StringPtr __thiscall kj::trimSourceFilename(kj *this,StringPtr filename)

{
  char *__s;
  ArrayPtr<const_char> AVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  StringPtr root;
  kj *local_68;
  StringPtr local_50;
  StringPtr local_40;
  
  pcVar5 = filename.content.ptr;
  local_68 = this;
LAB_0021b17c:
  pcVar4 = (char *)0x0;
  do {
    if (pcVar4 == pcVar5 + -1) {
      AVar1.size_ = (size_t)pcVar5;
      AVar1.ptr = (char *)local_68;
      return (StringPtr)AVar1;
    }
    if ((pcVar4 == (char *)0x0) || ((pcVar4 + -1)[(long)local_68] == '/')) {
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
        __s = *(char **)((long)trimSourceFilename::ROOTS + lVar6);
        sVar3 = strlen(__s);
        local_50.content.size_ = sVar3 + 1;
        local_50.content.ptr = __s;
        local_40.content.ptr = (char *)(local_68 + (long)pcVar4);
        local_40.content.size_ = (long)pcVar5 - (long)pcVar4;
        bVar2 = StringPtr::startsWith(&local_40,&local_50);
        if (bVar2) {
          local_68 = local_68 + (long)(pcVar4 + local_50.content.size_) + -1;
          pcVar5 = pcVar5 + -(long)(pcVar4 + (local_50.content.size_ - 1));
          goto LAB_0021b17c;
        }
      }
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

kj::StringPtr trimSourceFilename(kj::StringPtr filename) {
  // Removes noisy prefixes from source code file name.
  //
  // The goal here is to produce the "canonical" filename given the filename returned by e.g.
  // addr2line. addr2line gives us the full path of the file as passed on the compiler
  // command-line, which in turn is affected by build system and by whether and where we're
  // performing an out-of-tree build.
  //
  // To deal with all this, we look for directory names in the path which we recognize to be
  // locations that represent roots of the source tree. We strip said root and everything before
  // it.
  //
  // On Windows, we often get filenames containing backslashes. Since we aren't allowed to allocate
  // a new string here, we can't do much about this, so our returned "canonical" name will
  // unfortunately end up with backslashes.

  static constexpr const char* ROOTS[] = {
    "ekam-provider/canonical/",  // Ekam source file.
    "ekam-provider/c++header/",  // Ekam include file.
    "src/",                      // Non-Ekam source root.
    "tmp/",                      // Non-Ekam generated code.
#if _WIN32
    "src\\",                     // Win32 source root.
    "tmp\\",                     // Win32 generated code.
#endif
  };

retry:
  for (size_t i: kj::indices(filename)) {
    if (i == 0 || filename[i-1] == '/'
#if _WIN32
               || filename[i-1] == '\\'
#endif
        ) {
      // We're at the start of a directory name. Check for valid prefixes.
      for (kj::StringPtr root: ROOTS) {
        if (filename.slice(i).startsWith(root)) {
          filename = filename.slice(i + root.size());

          // We should keep searching to find the last instance of a root name. `i` is no longer
          // a valid index for `filename` so start the loop over.
          goto retry;
        }
      }
    }
  }

  return filename;
}